

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void __thiscall Fl_Type::insert(Fl_Type *this,Fl_Type *g)

{
  int iVar1;
  Fl_Type *pFVar2;
  Fl_Type *local_30;
  Fl_Type *t;
  Fl_Type *pFStack_20;
  int newlevel;
  Fl_Type *end;
  Fl_Type *g_local;
  Fl_Type *this_local;
  
  for (pFStack_20 = this; pFStack_20->next != (Fl_Type *)0x0; pFStack_20 = pFStack_20->next) {
  }
  this->parent = g->parent;
  iVar1 = g->level;
  this->visible = g->visible;
  for (local_30 = this->next; local_30 != (Fl_Type *)0x0; local_30 = local_30->next) {
    local_30->level = (iVar1 - this->level) + local_30->level;
  }
  this->level = iVar1;
  this->prev = g->prev;
  pFVar2 = this;
  if (this->prev != (Fl_Type *)0x0) {
    this->prev->next = this;
    pFVar2 = first;
  }
  first = pFVar2;
  pFStack_20->next = g;
  g->prev = pFStack_20;
  fixvisible(this);
  if (this->parent != (Fl_Type *)0x0) {
    (*this->parent->_vptr_Fl_Type[8])(this->parent,this,g);
  }
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  return;
}

Assistant:

void Fl_Type::insert(Fl_Type *g) {
  Fl_Type *end = this;
  while (end->next) end = end->next;
  parent = g->parent;
  int newlevel = g->level;
  visible = g->visible;
  for (Fl_Type *t = this->next; t; t = t->next) t->level += newlevel-level;
  level = newlevel;
  prev = g->prev;
  if (prev) prev->next = this; else first = this;
  end->next = g;
  g->prev = end;
  fixvisible(this);
  if (parent) parent->add_child(this, g);
  widget_browser->redraw();
}